

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_field_descs(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  t_javame_generator *ptVar2;
  pointer pptVar3;
  string local_90;
  string local_70;
  string local_50;
  
  for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    poVar1 = t_generator::indent((t_generator *)this,out);
    poVar1 = std::operator<<(poVar1,"private static final TField ");
    ptVar2 = (t_javame_generator *)&(*pptVar3)->name_;
    std::__cxx11::string::string((string *)&local_70,(string *)ptVar2);
    constant_name(&local_50,ptVar2,&local_70);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    poVar1 = std::operator<<(poVar1,"_FIELD_DESC = new TField(\"");
    poVar1 = std::operator<<(poVar1,(string *)&(*pptVar3)->name_);
    ptVar2 = (t_javame_generator *)0x2df5f6;
    poVar1 = std::operator<<(poVar1,"\", ");
    type_to_enum_abi_cxx11_(&local_90,ptVar2,(*pptVar3)->type_);
    poVar1 = std::operator<<(poVar1,(string *)&local_90);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"(short)");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*pptVar3)->key_);
    poVar1 = std::operator<<(poVar1,");");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void t_javame_generator::generate_field_descs(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "private static final TField " << constant_name((*m_iter)->get_name())
                << "_FIELD_DESC = new TField(\"" << (*m_iter)->get_name() << "\", "
                << type_to_enum((*m_iter)->get_type()) << ", "
                << "(short)" << (*m_iter)->get_key() << ");" << endl;
  }
}